

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O1

bool Js::DynamicTypeHandler::CheckHeuristicsForFixedDataProps
               (DynamicObject *instance,PropertyRecord *propertyRecord,Var value)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  DynamicTypeHandler *pDVar6;
  RootObjectInlineCache *this;
  
  bVar3 = Phases::IsEnabled((Phases *)&DAT_015b0240,FixDataPropsPhase);
  if (bVar3) {
    return true;
  }
  if (((ulong)value & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)value & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (((ulong)value & 0xffff000000000000) == 0x1000000000000) {
    pTVar1 = (instance->super_RecyclableObject).type.ptr;
    if ((pTVar1->typeId == TypeIds_GlobalObject) &&
       (bVar3 = ScriptContext::IsIntConstPropertyOnGlobalObject
                          ((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                           scriptContext.ptr,propertyRecord->pid), bVar3)) {
      return true;
    }
    pTVar1 = (instance->super_RecyclableObject).type.ptr;
    if ((pTVar1->typeId == TypeIds_Object) &&
       (bVar3 = ScriptContext::IsIntConstPropertyOnGlobalUserObject
                          ((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                           scriptContext.ptr,propertyRecord->pid), bVar3)) {
      return true;
    }
  }
  bVar3 = Phases::IsEnabled((Phases *)&DAT_015c1bd0,FixDataVarPropsPhase);
  if (bVar3) {
    pDVar6 = DynamicObject::GetTypeHandler(instance);
    if ((pDVar6->flags & 0x20) != 0) {
      return true;
    }
    if (((instance->super_RecyclableObject).type.ptr)->typeId == TypeIds_GlobalObject) {
      this = RootObjectBase::GetRootInlineCache
                       ((RootObjectBase *)instance,propertyRecord,false,true);
      uVar4 = RootObjectInlineCache::Release(this);
      return uVar4 < 2;
    }
  }
  return false;
}

Assistant:

bool DynamicTypeHandler::CheckHeuristicsForFixedDataProps(DynamicObject* instance, const PropertyRecord * propertyRecord, Var value)
    {
        if (PHASE_FORCE1(Js::FixDataPropsPhase))
        {
            return true;
        }

        if (Js::TaggedInt::Is(value) &&
            ((instance->GetTypeId() == TypeIds_GlobalObject && instance->GetScriptContext()->IsIntConstPropertyOnGlobalObject(propertyRecord->GetPropertyId())) ||
            (instance->GetTypeId() == TypeIds_Object && instance->GetScriptContext()->IsIntConstPropertyOnGlobalUserObject(propertyRecord->GetPropertyId()))))
        {
            return true;
        }

        // Disabled by default
        if (PHASE_ON1(Js::FixDataVarPropsPhase))
        {
            if (instance->GetTypeHandler()->GetFlags() & IsPrototypeFlag)
            {
                return true;
            }
            if (instance->GetType()->GetTypeId() == TypeIds_GlobalObject)
            {
                // if we have statically seen multiple stores - we should not do this optimization
                RootObjectInlineCache* cache = (static_cast<Js::RootObjectBase*>(instance))->GetRootInlineCache(propertyRecord, /*isLoadMethod*/ false, /*isStore*/ true);
                uint refCount = cache->Release();
                return refCount <= 1;
            }
        }
        return false;
    }